

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

shared_ptr<mocker::ast::UnaryExpr> __thiscall
mocker::Parser::
makeNode<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType,std::shared_ptr<mocker::ast::Expression>&>
          (Parser *this,Position beg,Position end,OpType *args,
          shared_ptr<mocker::ast::Expression> *args_1)

{
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *this_00;
  element_type *this_01;
  mapped_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::UnaryExpr> sVar1;
  NodeID local_78 [3];
  pair<mocker::Position,_mocker::Position> local_60;
  undefined1 local_39;
  size_t local_38;
  Parser *this_local;
  Position end_local;
  Position beg_local;
  shared_ptr<mocker::ast::UnaryExpr> *res;
  
  end_local.col = beg.col;
  this_local = (Parser *)end.col;
  local_39 = 0;
  local_38 = beg.line;
  end_local.line = (size_t)args;
  std::
  make_shared<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType,std::shared_ptr<mocker::ast::Expression>&>
            ((OpType *)this,args_1);
  std::make_pair<mocker::Position&,mocker::Position&>
            (&local_60,(Position *)&end_local.col,(Position *)&this_local);
  this_00 = *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
              **)(beg.line + 0x10);
  this_01 = std::
            __shared_ptr_access<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  local_78[0] = ast::ASTNode::getID((ASTNode *)this_01);
  this_02 = std::
            unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
            ::operator[](this_00,local_78);
  std::pair<mocker::Position,_mocker::Position>::operator=(this_02,&local_60);
  sVar1.super___shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::UnaryExpr>)
         sVar1.super___shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> makeNode(Position beg, Position end, Args &&... args) {
    auto res = std::make_shared<Node>(std::forward<Args>(args)...);
    pos[res->getID()] = std::make_pair(beg, end);
    return res;
  }